

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  int iVar1;
  connection_context_t *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  pcVar2 = (connection_context_t *)malloc(0x170);
  if (pcVar2 == (connection_context_t *)0x0) {
    pcVar4 = "context != NULL";
    uVar3 = 0x96;
  }
  else {
    pcVar2->sock = sock;
    pcVar2->is_server_connection = is_server_connection;
    pcVar2->read = 0;
    pcVar2->sent = 0;
    pcVar2->open_handles = 0;
    pcVar2->got_fin = 0;
    pcVar2->sent_fin = 0;
    pcVar2->got_disconnect = 0;
    pcVar2->events = 0;
    pcVar2->delayed_events = 0;
    uVar3 = uv_default_loop();
    iVar1 = uv_poll_init_socket(uVar3,pcVar2,sock);
    pcVar2->open_handles = pcVar2->open_handles + 1;
    (pcVar2->poll_handle).data = pcVar2;
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      iVar1 = uv_timer_init(uVar3,&pcVar2->timer_handle);
      pcVar2->open_handles = pcVar2->open_handles + 1;
      (pcVar2->timer_handle).data = pcVar2;
      if (iVar1 == 0) {
        return pcVar2;
      }
      pcVar4 = "r == 0";
      uVar3 = 0xab;
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0xa6;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT(context != NULL);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init_socket(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT(r == 0);

  return context;
}